

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processvid.cpp
# Opt level: O2

void unload_all_but_last_texture
               (vector<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_>
                *tex_buf)

{
  Texture2D texture;
  Texture2D texture_00;
  pointer ppVar1;
  
  for (ppVar1 = (tex_buf->
                super__Vector_base<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      ppVar1 != (tex_buf->
                super__Vector_base<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_>
                )._M_impl.super__Vector_impl_data._M_finish + -1; ppVar1 = ppVar1 + 1) {
    texture.id = (ppVar1->first).id;
    texture.width = (ppVar1->first).width;
    texture.height = (ppVar1->first).height;
    texture.mipmaps = (ppVar1->first).mipmaps;
    texture.format = (ppVar1->first).format;
    UnloadTexture(texture);
    texture_00.id = (ppVar1->second).id;
    texture_00.width = (ppVar1->second).width;
    texture_00.height = (ppVar1->second).height;
    texture_00.mipmaps = (ppVar1->second).mipmaps;
    texture_00.format = (ppVar1->second).format;
    UnloadTexture(texture_00);
  }
  return;
}

Assistant:

void unload_all_but_last_texture(
	std::vector<std::pair<Texture2D, Texture2D>> tex_buf)
{
	for (auto it = tex_buf.begin(); it != tex_buf.end()-1; ++it) {
		UnloadTexture(it->first);
		UnloadTexture(it->second);
	}
}